

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics_threaded.cpp
# Opt level: O3

void __thiscall CGraphics_Threaded::CGraphics_Threaded(CGraphics_Threaded *this)

{
  *(undefined8 *)&this->field_0x8 = 0;
  *(undefined ***)this = &PTR__IInterface_00211258;
  (this->m_InvalidTexture).m_Id = -1;
  (this->m_State).m_ScreenTL.x = 0.0;
  (this->m_State).m_ScreenTL.y = 0.0;
  (this->m_State).m_ScreenBR.x = 0.0;
  (this->m_State).m_ScreenBR.y = 0.0;
  (this->m_State).m_ClipEnable = false;
  (this->m_State).m_ClipX = 0;
  (this->m_State).m_ClipY = 0;
  (this->m_State).m_ClipW = 0;
  (this->m_State).m_ClipH = 0;
  (this->m_State).m_BlendMode = 0;
  (this->m_State).m_WrapModeU = 0;
  (this->m_State).m_WrapModeV = 0;
  (this->m_State).m_Texture = -1;
  this->m_NumVertices = 0;
  this->m_apCommandBuffers[0] = (CCommandBuffer *)0x0;
  this->m_apCommandBuffers[1] = (CCommandBuffer *)0x0;
  *(undefined8 *)((long)this->m_apCommandBuffers + 0xc) = 0;
  *(undefined8 *)((long)&this->m_pCommandBuffer + 4) = 0;
  *(undefined8 *)&this->field_0x10 = 0xffffffffffffffff;
  this->m_Rotation = 0.0;
  this->m_Drawing = 0;
  this->m_TextureMemoryUsage = 0;
  this->m_RenderEnable = true;
  this->m_DoScreenshot = false;
  return;
}

Assistant:

CGraphics_Threaded::CGraphics_Threaded()
{
	m_State.m_ScreenTL.x = 0;
	m_State.m_ScreenTL.y = 0;
	m_State.m_ScreenBR.x = 0;
	m_State.m_ScreenBR.y = 0;
	m_State.m_ClipEnable = false;
	m_State.m_ClipX = 0;
	m_State.m_ClipY = 0;
	m_State.m_ClipW = 0;
	m_State.m_ClipH = 0;
	m_State.m_Texture = -1;
	m_State.m_BlendMode = CCommandBuffer::BLEND_NONE;
	m_State.m_WrapModeU = WRAP_REPEAT;
	m_State.m_WrapModeV = WRAP_REPEAT;

	m_CurrentCommandBuffer = 0;
	m_pCommandBuffer = 0x0;
	m_apCommandBuffers[0] = 0x0;
	m_apCommandBuffers[1] = 0x0;

	m_NumVertices = 0;

	m_ScreenWidth = -1;
	m_ScreenHeight = -1;

	m_Rotation = 0;
	m_Drawing = 0;

	m_TextureMemoryUsage = 0;

	m_RenderEnable = true;
	m_DoScreenshot = false;
}